

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetSystemNoiseCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *Q)

{
  long lVar1;
  MatrixDynSize *in_RSI;
  long *in_RDI;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  if ((lVar1 == *in_RDI) && (lVar1 = iDynTree::MatrixDynSize::cols(), lVar1 == *in_RDI)) {
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x31),in_RSI);
    *(undefined1 *)((long)in_RDI + 0x1dd) = 1;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetSystemNoiseCovariance",
             "Could not set KF system noise covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetSystemNoiseCovariance(const iDynTree::MatrixDynSize& Q)
{
    if ( (Q.rows() != m_dim_X) || (Q.cols() != m_dim_X))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetSystemNoiseCovariance", "Could not set KF system noise covariance - dimension mismatch");
        return false;
    }

    m_Q = Q;
    m_system_noise_covariance_matrix_set = true;
    return true;
}